

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

REJECTED_HANDLE rejected_clone(REJECTED_HANDLE value)

{
  AMQP_VALUE pAVar1;
  REJECTED_HANDLE local_18;
  REJECTED_INSTANCE *rejected_instance;
  REJECTED_HANDLE value_local;
  
  local_18 = (REJECTED_HANDLE)malloc(8);
  if (local_18 != (REJECTED_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (REJECTED_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

REJECTED_HANDLE rejected_clone(REJECTED_HANDLE value)
{
    REJECTED_INSTANCE* rejected_instance = (REJECTED_INSTANCE*)malloc(sizeof(REJECTED_INSTANCE));
    if (rejected_instance != NULL)
    {
        rejected_instance->composite_value = amqpvalue_clone(((REJECTED_INSTANCE*)value)->composite_value);
        if (rejected_instance->composite_value == NULL)
        {
            free(rejected_instance);
            rejected_instance = NULL;
        }
    }

    return rejected_instance;
}